

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O1

void Am_Stepping_Animator_Animation_proc(Am_Object *interp,Am_Time *elapsed_time)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  unsigned_long uVar3;
  Am_Value *pAVar4;
  Am_Value *pAVar5;
  Am_Value *keep_running_00;
  Am_Value_List *this;
  bool keep_running;
  Am_Value_List values;
  Am_Value_List value2s;
  Am_Value curr_value;
  Am_Value_List result;
  Am_Value_List steps;
  Am_Value value2;
  Am_Value step_size;
  Am_Value_List local_d8;
  Am_Object *local_c8;
  Am_Value_List local_c0;
  Am_Value local_b0;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Value_List local_90;
  Am_Value_List local_80;
  Am_Value local_70;
  Am_Value_List local_60;
  Am_Value local_50;
  Am_Value local_40;
  
  pAVar2 = Am_Time::operator_cast_to_Am_Wrapper_(elapsed_time);
  Am_Object::Set(interp,0xea,pAVar2,0);
  uVar3 = Am_Time::Milliseconds(elapsed_time);
  if (uVar3 != 0) {
    pAVar4 = Am_Object::Get(interp,0x169,0);
    Am_Value::Am_Value(&local_b0,pAVar4);
    local_c8 = interp;
    pAVar4 = Am_Object::Get(interp,0x183,0);
    Am_Value::Am_Value(&local_50,pAVar4);
    pAVar4 = Am_Object::Get(local_c8,0x182,0);
    Am_Value::Am_Value(&local_70,pAVar4);
    bVar1 = Am_Value_List::Test(&local_b0);
    if (bVar1) {
      Am_Value_List::Am_Value_List(&local_d8,&local_b0);
      Am_Value_List::Am_Value_List(&local_80,&local_50);
      bVar1 = Am_Value::Exists(&local_70);
      if (bVar1) {
        Am_Value_List::Am_Value_List(&local_c0,&local_70);
        Am_Value_List::Am_Value_List(&local_90);
        Am_Value_List::Start(&local_d8);
        Am_Value_List::Start(&local_80);
        Am_Value_List::Start(&local_c0);
        while (((bVar1 = Am_Value_List::Last(&local_d8), !bVar1 &&
                (bVar1 = Am_Value_List::Last(&local_80), !bVar1)) &&
               (bVar1 = Am_Value_List::Last(&local_c0), !bVar1))) {
          pAVar4 = Am_Value_List::Get(&local_d8);
          pAVar5 = Am_Value_List::Get(&local_80);
          keep_running_00 = Am_Value_List::Get(&local_c0);
          step_1D(&local_40,pAVar4,pAVar5,(bool *)keep_running_00);
          Am_Value_List::Add(&local_90,&local_40,Am_TAIL,true);
          Am_Value::~Am_Value(&local_40);
          Am_Value_List::Next(&local_d8);
          Am_Value_List::Next(&local_80);
          Am_Value_List::Next(&local_c0);
        }
        pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_90);
        Am_Value::Am_Value((Am_Value *)&local_60,pAVar2);
        Am_Value_List::~Am_Value_List(&local_90);
      }
      else {
        Am_Value_List::Am_Value_List(&local_c0);
        Am_Value_List::Start(&local_d8);
        Am_Value_List::Start(&local_80);
        while ((bVar1 = Am_Value_List::Last(&local_d8), !bVar1 &&
               (bVar1 = Am_Value_List::Last(&local_80), !bVar1))) {
          pAVar4 = Am_Value_List::Get(&local_d8);
          pAVar5 = Am_Value_List::Get(&local_80);
          step_1D((Am_Value *)&local_90,pAVar4,pAVar5,(bool *)&Am_No_Value);
          Am_Value_List::Add(&local_c0,(Am_Value *)&local_90,Am_TAIL,true);
          Am_Value::~Am_Value((Am_Value *)&local_90);
          Am_Value_List::Next(&local_d8);
          Am_Value_List::Next(&local_80);
        }
        pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_c0);
        Am_Value::Am_Value((Am_Value *)&local_60,pAVar2);
      }
      Am_Value_List::~Am_Value_List(&local_c0);
      Am_Value_List::~Am_Value_List(&local_80);
      Am_Value_List::~Am_Value_List(&local_d8);
      Am_Value::operator=(&local_b0,(Am_Value *)&local_60);
      this = &local_60;
    }
    else {
      step_1D((Am_Value *)&local_d8,&local_b0,&local_50,(bool *)&local_70);
      Am_Value::operator=(&local_b0,(Am_Value *)&local_d8);
      this = &local_d8;
    }
    Am_Value::~Am_Value((Am_Value *)this);
    Am_Object::Set(local_c8,0x169,&local_b0,0);
    pAVar4 = Am_Object::Get(local_c8,200,0);
    Am_Object_Method::Am_Object_Method((Am_Object_Method *)&local_d8,pAVar4);
    if (local_d8.item != (Am_List_Item *)0x0) {
      Am_Object::Am_Object(&local_98,local_c8);
      (*(code *)local_d8.item)(&local_98);
      Am_Object::~Am_Object(&local_98);
    }
    Am_Object::Am_Object(&local_a0,local_c8);
    Am_Set_Animated_Slots(&local_a0);
    Am_Object::~Am_Object(&local_a0);
    Am_Value::~Am_Value(&local_70);
    Am_Value::~Am_Value(&local_50);
    Am_Value::~Am_Value(&local_b0);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Timer_Method, void, Am_Stepping_Animator_Animation,
                 (Am_Object interp, const Am_Time &elapsed_time))
{
  interp.Set(Am_ELAPSED_TIME, elapsed_time);
  if (elapsed_time.Milliseconds() == 0)
    return;

  Am_Value curr_value = interp.Get(Am_VALUE);
  Am_Value step_size = interp.Get(Am_SMALL_INCREMENT);
  Am_Value value2 = interp.Get(Am_VALUE_2);

  bool keep_running = false;
  if (Am_Value_List::Test(curr_value))
    curr_value = step_ND(curr_value, step_size, value2, keep_running);
  else
    curr_value = step_1D(curr_value, step_size, value2, keep_running);

  Am_INTER_TRACE_PRINT(interp, "Stepper Animation " << interp << " new value "
                                                    << curr_value);

  interp.Set(Am_VALUE, curr_value);

  if (!keep_running) {
    Am_Object_Method method = interp.Get(Am_INTERIM_DO_METHOD);
    if (method.Valid())
      method.Call(interp);
  }

  Am_Set_Animated_Slots(interp);
}